

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmPageSettings::Read(ON_3dmPageSettings *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  int local_20 [2];
  
  local_20[0] = 0;
  local_20[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_20,local_20 + 1);
  if (bVar1) {
    if (((((local_20[0] == 1) &&
          (bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_page_number), bVar1)) &&
         (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_width_mm), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_height_mm), bVar1 &&
         (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_left_margin_mm), bVar1)))) &&
       ((bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_right_margin_mm), bVar1 &&
        ((bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_top_margin_mm), bVar1 &&
         (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_bottom_margin_mm), bVar1)))))) {
      bVar1 = ON_BinaryArchive::ReadString(archive,&this->m_printer_name);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_3dmPageSettings::Read(ON_BinaryArchive& archive)
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadInt(&m_page_number );
    if (!rc) break;

    rc = archive.ReadDouble(&m_width_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_height_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_left_margin_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_right_margin_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_top_margin_mm);
    if ( !rc) break;

    rc = archive.ReadDouble(&m_bottom_margin_mm);
    if ( !rc) break;

    rc = archive.ReadString(m_printer_name);
    if (!rc) break;

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}